

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_random_dist.h
# Opt level: O2

void __thiscall PlayerRandomDist::PlayerRandomDist(PlayerRandomDist *this,string *name)

{
  time_t tVar1;
  
  Player::Player(&this->super_Player,name);
  (this->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010ca88;
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  return;
}

Assistant:

PlayerRandomDist(const std::string& name) :
		Player(name)
	{
		srand(time(0));
	}